

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_drow_talisman(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  OBJ_DATA *in_stack_00000038;
  CHAR_DATA *in_stack_00000040;
  CHAR_DATA *in_stack_00000048;
  int in_stack_00000050;
  int in_stack_00000054;
  void *in_stack_ffffffffffffffe8;
  
  bVar1 = is_worn((OBJ_DATA *)in_RDI);
  if (((bVar1) && (iVar2 = number_percent(), iVar2 < 8)) && (*(long *)((long)in_RSI + 0x20) != 0)) {
    act(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    iVar2 = number_percent();
    if (iVar2 < 0x33) {
      skill_lookup((char *)in_RDI);
      obj_cast_spell(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                     in_stack_00000038);
    }
    else {
      skill_lookup((char *)in_RDI);
      obj_cast_spell(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                     in_stack_00000038);
    }
  }
  return;
}

Assistant:

void fight_prog_drow_talisman(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_worn(obj) || number_percent() > 7 || !ch->fighting)
		return;

	act("$p pulses and glows a sickly shade of green!", ch, obj, 0, TO_ALL);

	if (number_percent() > 50)
		obj_cast_spell(skill_lookup("frost breath"), ch->level, ch, ch->fighting, obj);
	else
		obj_cast_spell(skill_lookup("acid blast"), 60, ch, ch->fighting, obj);
}